

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_Mesh::Read(ON_Mesh *this,ON_BinaryArchive *file)

{
  ON_2dPointArray *this_00;
  undefined1 *this_01;
  undefined1 *this_02;
  ON_2fPoint OVar1;
  ON_2dPoint *src;
  ON_3dPoint *outbuffer;
  double dVar2;
  double t;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  endian eVar8;
  uint uVar9;
  ON_MeshCurvatureStats *this_03;
  ON_MeshNgon *pOVar10;
  ON_MeshParameters *this_04;
  char *sFormat;
  byte bVar11;
  ON_Mesh *pOVar12;
  long lVar13;
  int iVar14;
  ON_BinaryArchive *t_00;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  endian extraout_XMM0_Dd;
  ON_3fVector OVar18;
  uchar b;
  ON_Mesh *local_e0;
  undefined1 local_d4 [4];
  int minor_version;
  uint Vcount;
  bool bHasNgons;
  ON__UINT32 tcode;
  int vcount;
  uint ngon_count;
  int b_packed_tex_rotate;
  undefined1 auStack_b4 [12];
  double dStack_b0;
  int major_version;
  bool bFailedCRC;
  float local_98;
  int fcount;
  uint Fcount;
  undefined1 local_88 [16];
  ON__INT64 big_value;
  float fbbox [2] [3];
  int minor_version_1;
  double local_48;
  endian eStack_3c;
  ON_MappingTag *local_38;
  
  Destroy(this);
  major_version = 0;
  minor_version = 0;
  bVar5 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  if (!bVar5) {
    return false;
  }
  if ((major_version & 0xfffffffdU) != 1) {
    return true;
  }
  t_00 = (ON_BinaryArchive *)&vcount;
  vcount = 0;
  fcount = 0;
  local_e0 = this;
  bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)t_00);
  if (bVar5) {
    t_00 = (ON_BinaryArchive *)&fcount;
    bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)t_00);
    if (!bVar5) goto LAB_005141b2;
    t_00 = (ON_BinaryArchive *)&local_e0->field_0x270;
    bVar5 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)t_00);
    if (!bVar5) goto LAB_005141b2;
    t_00 = (ON_BinaryArchive *)&local_e0->field_0x280;
    bVar5 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)t_00);
    if (!bVar5) goto LAB_005141b2;
    t_00 = (ON_BinaryArchive *)&local_e0->field_0x240;
    bVar5 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)t_00);
    if (!bVar5) goto LAB_005141b2;
    t_00 = (ON_BinaryArchive *)&local_e0->field_0x250;
    bVar5 = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)t_00);
    pOVar12 = local_e0;
    if (!bVar5) goto LAB_005141b2;
    t_00 = (ON_BinaryArchive *)0x2;
    bVar5 = ON_BinaryArchive::ReadDouble(file,2,local_e0->m_srf_scale);
    fbbox[0][0] = 1.0;
    fbbox[0][1] = 1.0;
    fbbox[0][2] = 1.0;
    fbbox[1][0] = -1.0;
    fbbox[1][1] = -1.0;
    fbbox[1][2] = -1.0;
    if (!bVar5) goto LAB_005141ce;
    t_00 = (ON_BinaryArchive *)0x6;
    bVar5 = ON_BinaryArchive::ReadFloat(file,6,fbbox[0]);
    if (!bVar5) goto LAB_005141ce;
    if (fbbox[0][0] <= fbbox[1][0]) {
      if (fbbox[0][1] <= fbbox[1][1]) {
        if (fbbox[0][2] <= fbbox[1][2]) {
          ON_3fPoint::ON_3fPoint((ON_3fPoint *)&b_packed_tex_rotate,fbbox[0]);
          ON_3dPoint::operator=(&(local_e0->m_vertex_bbox).m_min,(ON_3fPoint *)&b_packed_tex_rotate)
          ;
          pOVar12 = local_e0;
          ON_3fPoint::ON_3fPoint((ON_3fPoint *)&b_packed_tex_rotate,fbbox[1]);
          ON_3dPoint::operator=(&(pOVar12->m_vertex_bbox).m_max,(ON_3fPoint *)&b_packed_tex_rotate);
        }
      }
    }
    t_00 = (ON_BinaryArchive *)0x6;
    bVar5 = ON_BinaryArchive::ReadFloat(file,6,pOVar12->m_nbox[0]);
    if (!bVar5) goto LAB_005141ce;
    t_00 = (ON_BinaryArchive *)0x4;
    bVar5 = ON_BinaryArchive::ReadFloat(file,4,pOVar12->m_tbox[0]);
    local_d4 = (undefined1  [4])0xffffffff;
    if (!bVar5) goto LAB_005141ce;
    t_00 = (ON_BinaryArchive *)local_d4;
    bVar5 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)t_00);
    if (!bVar5) goto LAB_005141ce;
    if ((local_d4 == (undefined1  [4])0x2) || (local_d4 == (undefined1  [4])0x1)) {
      if (pOVar12->m_mesh_is_closed != '\x01') {
        pOVar12->m_mesh_is_closed = '\x01';
        goto LAB_005149c3;
      }
    }
    else if ((local_d4 == (undefined1  [4])0x0) &&
            (pOVar12->m_mesh_is_solid = '\x03', pOVar12->m_mesh_is_closed != '\x02')) {
      pOVar12->m_mesh_is_closed = '\x02';
LAB_005149c3:
      local_e0->m_mesh_is_manifold = '\0';
      local_e0->m_mesh_is_oriented = '\0';
    }
    t_00 = (ON_BinaryArchive *)&b;
    tcode = 0;
    b = '\0';
    big_value = 0;
    bVar5 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)t_00);
    if ((bVar5) && (b != '\0')) {
      t_00 = (ON_BinaryArchive *)&tcode;
      bVar5 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)t_00,&big_value);
      if (bVar5) {
        bVar6 = false;
        if (tcode == 0x40008000) {
          this_04 = (ON_MeshParameters *)operator_new(0xe0);
          memset(this_04,0,0xe0);
          ON_MeshParameters::ON_MeshParameters(this_04);
          local_e0->m_mesh_parameters = this_04;
          t_00 = file;
          bVar6 = ON_MeshParameters::Read(this_04,file);
        }
        bVar7 = ON_BinaryArchive::EndRead3dmChunk(file);
        bVar5 = false;
        if (bVar7) {
          bVar5 = bVar6;
        }
        goto LAB_005141e0;
      }
      goto LAB_005141de;
    }
  }
  else {
LAB_005141b2:
    fbbox[0][0] = 1.0;
    fbbox[0][1] = 1.0;
    fbbox[0][2] = 1.0;
    fbbox[1][0] = -1.0;
    fbbox[1][1] = -1.0;
    fbbox[1][2] = -1.0;
LAB_005141ce:
    b = '\0';
    tcode = 0;
    big_value = 0;
LAB_005141de:
    bVar5 = false;
  }
LAB_005141e0:
  for (local_d4 = (undefined1  [4])0x0; (pOVar12 = local_e0, bVar5 != false && ((int)local_d4 < 4));
      local_d4 = (undefined1  [4])((int)local_d4 + 1)) {
    t_00 = (ON_BinaryArchive *)&b;
    bVar5 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&b);
    if ((bVar5) && (b != '\0')) {
      tcode = 0;
      big_value = 0;
      t_00 = (ON_BinaryArchive *)&tcode;
      bVar5 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)&tcode,&big_value);
      if (bVar5) {
        if (tcode == 0x40008000) {
          this_03 = (ON_MeshCurvatureStats *)operator_new(0x40);
          ON_MeshCurvatureStats::ON_MeshCurvatureStats(this_03);
          local_e0->m_kstat[(int)local_d4] = this_03;
          t_00 = file;
          bVar5 = ON_MeshCurvatureStats::Read(this_03,file);
        }
        else {
          bVar5 = false;
        }
        bVar6 = ON_BinaryArchive::EndRead3dmChunk(file);
        if (!bVar6) {
          bVar5 = false;
        }
      }
      else {
        bVar5 = false;
      }
    }
  }
  if (bVar5 != false) {
    bVar5 = ReadFaceArray(local_e0,(int)t_00,fcount,file);
  }
  if (bVar5 != false) {
    if (major_version == 3) {
      bVar5 = Read_2(pOVar12,vcount,file);
    }
    else if (major_version == 1) {
      bVar5 = Read_1(pOVar12,file);
    }
    else {
      bVar5 = false;
    }
  }
  if (minor_version < 2) goto LAB_005147a1;
  b_packed_tex_rotate = (uint)pOVar12->m_packed_tex_rotate;
  uVar9 = (uint)pOVar12->m_packed_tex_rotate;
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadInt(file,&b_packed_tex_rotate);
    pOVar12 = local_e0;
    uVar9 = b_packed_tex_rotate;
  }
  pOVar12->m_packed_tex_rotate = uVar9 != 0;
  if ((major_version != 3) || (minor_version < 3)) goto LAB_005147a1;
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadUuid(file,&(pOVar12->m_Ttag).m_mapping_id);
  }
  if ((bVar5 != false) && (0 < vcount)) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dStack_b0;
    _b_packed_tex_rotate = (ON_2dPoint)(auVar3 << 0x40);
    _bFailedCRC = _bFailedCRC & 0xffffffffffffff00;
    bVar5 = ON_BinaryArchive::ReadCompressedBufferSize(file,(size_t *)&b_packed_tex_rotate);
    pOVar12 = local_e0;
    if (_b_packed_tex_rotate != (ON_MeshNgon *)0x0 && bVar5) {
      if (_b_packed_tex_rotate == (ON_MeshNgon *)((long)vcount << 4)) {
        ON_SimpleArray<ON_2dPoint>::SetCapacity
                  (&(local_e0->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)vcount);
        bVar5 = ON_BinaryArchive::ReadCompressedBuffer
                          (file,(size_t)_b_packed_tex_rotate,
                           (pOVar12->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a,&bFailedCRC);
        if (((bVar5) && (-1 < vcount)) &&
           (vcount <= (pOVar12->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity)) {
          (pOVar12->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = vcount;
        }
        eVar8 = ON_BinaryArchive::Endian(file);
        if (eVar8 == big_endian) {
          src = (pOVar12->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a;
          ON_BinaryArchive::ToggleByteOrder
                    ((long)(pOVar12->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count * 2,8,src,src);
        }
      }
      else {
        bVar5 = false;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0xa6a,"","ON_Mesh::Read - surface parameter buffer size is wrong.");
        uVar9 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
        if (uVar9 < 0xbfb2f6a) {
          if (_b_packed_tex_rotate < (ON_MeshNgon *)0x10 ||
              ((undefined1  [16])_b_packed_tex_rotate & (undefined1  [16])0xf) !=
              (undefined1  [16])0x0) {
            bVar5 = false;
          }
          else {
            this_00 = &local_e0->m_S;
            ON_SimpleArray<ON_2dPoint>::SetCapacity
                      (&this_00->super_ON_SimpleArray<ON_2dPoint>,
                       (long)(int)((ulong)_b_packed_tex_rotate >> 4));
            bVar5 = ON_BinaryArchive::ReadCompressedBuffer
                              (file,(size_t)_b_packed_tex_rotate,
                               (local_e0->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a,&bFailedCRC);
            pOVar12 = local_e0;
            ON_SimpleArray<ON_2dPoint>::Destroy(&this_00->super_ON_SimpleArray<ON_2dPoint>);
          }
        }
      }
    }
  }
  if ((minor_version < 4) ||
     (uVar9 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), uVar9 < 0xbf5013a))
  goto LAB_005147a1;
  if (bVar5 != false) {
    bVar5 = ON_MappingTag::Read(&pOVar12->m_Ttag,file);
  }
  if (minor_version < 5) goto LAB_005147a1;
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadChar(file,&pOVar12->m_mesh_is_manifold);
  }
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadChar(file,&pOVar12->m_mesh_is_oriented);
  }
  if (bVar5 != false) {
    bVar5 = ON_BinaryArchive::ReadChar(file,&pOVar12->m_mesh_is_solid);
  }
  if ((bVar5 == false) || (minor_version < 6)) goto LAB_005147a1;
  bHasNgons = false;
  bVar5 = ON_BinaryArchive::ReadBool(file,&bHasNgons);
  if (!bVar5) {
LAB_0051479f:
    bVar5 = false;
    goto LAB_005147a1;
  }
  bVar5 = true;
  if (bHasNgons == true) {
    if (-1 < (pOVar12->m_Ngon).m_capacity) {
      (pOVar12->m_Ngon).m_count = 0;
    }
    _bFailedCRC = _bFailedCRC & 0xffffffff00000000;
    minor_version_1 = 0;
    bVar5 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,(int *)&bFailedCRC,&minor_version_1)
    ;
    if (bVar5) {
      ngon_count = 0;
      bVar5 = ON_BinaryArchive::ReadInt(file,&ngon_count);
      uVar9 = 0;
      if (bVar5) {
        ON_SimpleArray<ON_MeshNgon_*>::Reserve(&pOVar12->m_Ngon,(ulong)ngon_count);
        for (; uVar9 < ngon_count; uVar9 = uVar9 + 1) {
          Vcount = 0;
          bVar5 = ON_BinaryArchive::ReadInt(file,&Vcount);
          if (!bVar5) break;
          if (Vcount != 0) {
            bVar5 = ON_BinaryArchive::ReadInt(file,&Fcount);
            if (!bVar5) break;
            pOVar10 = ON_MeshNgonAllocator::AllocateNgon(&pOVar12->m_NgonAllocator,Vcount,Fcount);
            _b_packed_tex_rotate = pOVar10;
            bVar5 = ON_BinaryArchive::ReadInt(file,(ulong)Vcount,pOVar10->m_vi);
            if (!bVar5) break;
            bVar5 = ON_BinaryArchive::ReadInt
                              (file,(ulong)_b_packed_tex_rotate->m_Fcount,_b_packed_tex_rotate->m_fi
                              );
            if (!bVar5) break;
            ON_SimpleArray<ON_MeshNgon_*>::Append
                      (&pOVar12->m_Ngon,(ON_MeshNgon **)&b_packed_tex_rotate);
          }
        }
        uVar9 = (uint)(ngon_count == uVar9);
        pOVar12 = local_e0;
      }
      bVar5 = ON_BinaryArchive::EndRead3dmChunk(file);
      bVar5 = (bool)(bVar5 & (byte)uVar9);
    }
    else {
      bVar5 = false;
    }
  }
  if ((bVar5 == false) || (minor_version < 7)) goto LAB_005147a1;
  ngon_count = ngon_count & 0xffffff00;
  bVar5 = ON_BinaryArchive::ReadBool(file,(bool *)&ngon_count);
  pOVar12 = local_e0;
  if ((char)ngon_count == '\x01') {
    if (-1 < (local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
      (local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count = 0;
    }
    _bFailedCRC = _bFailedCRC & 0xffffffff00000000;
    minor_version_1 = 0;
    bVar5 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,(int *)&bFailedCRC,&minor_version_1)
    ;
    if (!bVar5) goto LAB_0051479f;
    local_88._0_8_ = &pOVar12->m_dV;
    if (_bFailedCRC == 1.4013e-45) {
      Vcount = 0;
      bVar5 = ON_BinaryArchive::ReadInt(file,&Vcount);
      if (!bVar5) goto LAB_00514af8;
      if (Vcount != 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = dStack_b0;
        _b_packed_tex_rotate = (ON_2dPoint)(auVar4 << 0x40);
        bVar5 = ON_BinaryArchive::ReadCompressedBufferSize(file,(size_t *)&b_packed_tex_rotate);
        if (bVar5) {
          if (_b_packed_tex_rotate == (ON_MeshNgon *)((ulong)Vcount * 0x18)) {
            ON_SimpleArray<ON_3dPoint>::SetCapacity
                      ((ON_SimpleArray<ON_3dPoint> *)local_88._0_8_,(ulong)Vcount);
            if (((int)Vcount < 0) ||
               ((local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity < (int)Vcount)) {
              uVar9 = (local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
            }
            else {
              (local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count = Vcount;
              uVar9 = Vcount;
            }
            outbuffer = (local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a;
            if ((outbuffer != (ON_3dPoint *)0x0) && (Vcount == uVar9)) {
              Fcount = Fcount & 0xffffff00;
              bVar5 = ON_BinaryArchive::ReadCompressedBuffer
                                (file,(size_t)_b_packed_tex_rotate,outbuffer,(bool *)&Fcount);
              bVar11 = 1;
              if (bVar5) goto LAB_00514b09;
              goto LAB_00514af8;
            }
            sFormat = "Unable to allocate double precision vertex point array.";
            iVar14 = 0x85f;
          }
          else {
            sFormat = "Compressed double precision vertex point buffer size is wrong.";
            iVar14 = 0x856;
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                     ,iVar14,"",sFormat);
        }
        goto LAB_00514af8;
      }
      bVar11 = 1;
    }
    else {
LAB_00514af8:
      if (-1 < (local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
        (local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count = 0;
      }
      bVar11 = 0;
    }
LAB_00514b09:
    bVar5 = ON_BinaryArchive::EndRead3dmChunk(file);
    pOVar12 = local_e0;
    if ((bVar5 & bVar11) != 1) {
      bVar5 = false;
      goto LAB_005147a1;
    }
    uVar9 = (local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (uVar9 == (local_e0->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) {
      lVar13 = 0;
      for (lVar15 = 0; (ulong)uVar9 * 0xc - lVar15 != 0; lVar15 = lVar15 + 0xc) {
        ON_3fPoint::ON_3fPoint
                  ((ON_3fPoint *)&b_packed_tex_rotate,
                   (ON_3dPoint *)
                   ((long)&((pOVar12->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar13));
        local_48 = ON_3fPoint::MaximumCoordinate
                             ((ON_3fPoint *)
                              ((long)&((pOVar12->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a)->x +
                              lVar15));
        eStack_3c = extraout_XMM0_Dd & 0x7fffffff;
        local_48 = ABS(local_48);
        OVar18 = ON_3fPoint::operator-
                           ((ON_3fPoint *)&b_packed_tex_rotate,
                            (ON_3fPoint *)
                            ((long)&((pOVar12->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a)->x +
                            lVar15));
        local_98 = OVar18.z;
        _bFailedCRC = OVar18._0_8_;
        dVar2 = ON_3fVector::MaximumCoordinate((ON_3fVector *)&bFailedCRC);
        if (local_48 * 1e-06 < ABS(dVar2)) {
          ON_SimpleArray<ON_3dPoint>::Destroy((ON_SimpleArray<ON_3dPoint> *)local_88._0_8_);
          bVar6 = true;
          goto LAB_00514be6;
        }
        lVar13 = lVar13 + 0x18;
      }
    }
    bVar6 = false;
LAB_00514be6:
    bVar5 = true;
    if (((local_e0->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count ==
         (local_e0->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) && (minor_version < 8)) {
      ON_BoundingBox::Set(&local_e0->m_vertex_bbox,(ON_SimpleArray<ON_3dPoint> *)local_88._0_8_,0);
    }
  }
  else {
    bVar6 = false;
  }
  if ((bVar5 != false) && (7 < minor_version)) {
    bVar5 = ON_BinaryArchive::ReadBoundingBox(file,&local_e0->m_vertex_bbox);
  }
  pOVar12 = local_e0;
  if (bVar6) {
    ON_BoundingBox::Set(&local_e0->m_vertex_bbox,&(local_e0->m_V).super_ON_SimpleArray<ON_3fPoint>,0
                       );
  }
LAB_005147a1:
  if ((((pOVar12->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == 0) &&
      (iVar14 = (pOVar12->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar14)) &&
     ((pOVar12->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar14)) {
    bVar6 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar12->field_0x240);
    if (bVar6) {
      bVar6 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar12->field_0x250);
      if (bVar6) {
        this_01 = &pOVar12->field_0x270;
        bVar6 = ON_Interval::IsInterval((ON_Interval *)this_01);
        if (bVar6) {
          this_02 = &pOVar12->field_0x280;
          bVar6 = ON_Interval::IsInterval((ON_Interval *)this_02);
          if ((bVar6) && ((pOVar12->m_Ttag).m_mapping_crc == 0)) {
            local_38 = &pOVar12->m_Ttag;
            bVar6 = ON_UuidIsNil(&local_38->m_mapping_id);
            if (bVar6) {
              ON_SimpleArray<ON_2dPoint>::SetCapacity
                        (&(pOVar12->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)vcount);
              if (-1 < (local_e0->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
                (local_e0->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
              }
              for (local_d4 = (undefined1  [4])0x0; (int)local_d4 < vcount;
                  local_d4 = (undefined1  [4])((int)local_d4 + 1)) {
                OVar1 = (local_e0->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a[(int)local_d4];
                dVar2 = (double)OVar1.x;
                t = (double)OVar1.y;
                uVar16 = SUB84(t,0);
                uVar17 = (undefined4)((ulong)t >> 0x20);
                unique0x100003e7 = uVar16;
                _b_packed_tex_rotate = (ON_MeshNgon *)dVar2;
                unique0x100003eb = uVar17;
                if (local_e0->m_packed_tex_rotate == true) {
                  local_88._8_4_ = uVar16;
                  local_88._0_8_ = dVar2;
                  local_88._12_4_ = uVar17;
                  local_48 = ON_Interval::NormalizedParameterAt((ON_Interval *)this_02,t);
                  dVar2 = ON_Interval::NormalizedParameterAt
                                    ((ON_Interval *)this_01,(double)local_88._0_8_);
                  local_88._0_8_ = 1.0 - dVar2;
                }
                else {
                  local_88._8_4_ = uVar16;
                  local_88._0_8_ = t;
                  local_88._12_4_ = uVar17;
                  local_48 = ON_Interval::NormalizedParameterAt((ON_Interval *)this_01,dVar2);
                  dVar2 = ON_Interval::NormalizedParameterAt
                                    ((ON_Interval *)this_02,(double)local_88._0_8_);
                  local_88._0_8_ = dVar2;
                }
                dVar2 = ON_Interval::ParameterAt((ON_Interval *)&pOVar12->field_0x240,local_48);
                _b_packed_tex_rotate = (ON_MeshNgon *)dVar2;
                dVar2 = ON_Interval::ParameterAt
                                  ((ON_Interval *)&pOVar12->field_0x250,(double)local_88._0_8_);
                dStack_b0 = dVar2;
                ON_SimpleArray<ON_2dPoint>::Append
                          (&(pOVar12->m_S).super_ON_SimpleArray<ON_2dPoint>,
                           (ON_2dPoint *)&b_packed_tex_rotate);
              }
              ON_MappingTag::SetDefaultSurfaceParameterMappingTag(local_38);
            }
          }
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool ON_Mesh::Read( ON_BinaryArchive& file )
{
  Destroy();

  int major_version = 0;
  int minor_version = 0;
  int i;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  
  if (rc && (1 == major_version || 3 == major_version) ) 
  {
    int vcount = 0;
    int fcount = 0;

    if (rc) rc = file.ReadInt( &vcount );
    if (rc) rc = file.ReadInt( &fcount );
    if (rc) rc = file.ReadInterval( m_packed_tex_domain[0] );
    if (rc) rc = file.ReadInterval( m_packed_tex_domain[1] );
    if (rc) rc = file.ReadInterval( m_srf_domain[0] );
    if (rc) rc = file.ReadInterval( m_srf_domain[1] );
    if (rc) rc = file.ReadDouble( 2, m_srf_scale );

    float fbbox[2][3] = { { 1.0f, 1.0f, 1.0f }, { -1.0f, -1.0f, -1.0f } };
    if (rc) rc = file.ReadFloat( 6, &fbbox[0][0] );
    if (rc && fbbox[0][0] <= fbbox[1][0] && fbbox[0][1] <= fbbox[1][1] && fbbox[0][2] <= fbbox[1][2] )
    {
      // When minor_version >= 8, m_vertex_bbox will be read from the archive later.
      m_vertex_bbox.m_min = ON_3fPoint(fbbox[0]);
      m_vertex_bbox.m_max = ON_3fPoint(fbbox[1]);
    }

    if (rc) rc = file.ReadFloat( 6, &m_nbox[0][0] );
    if (rc) rc = file.ReadFloat( 4, &m_tbox[0][0] );

    // int value meaning: -1 = unknown 0 = mesh is not closed, 1 = mesh is closed
    i = -1;
    if (rc) rc = file.ReadInt( &i );
    if (rc)
    {
      switch(i)
      {
      case 0: // not closed;
        SetClosed(0);
        break;
      case 1: // closed;
        SetClosed(1);
        break;
      case 2: // 13 April 2010 Dale Lear - "2" value is obsolete but appears in old files
        SetClosed(1);
        break;
      }
    }

    unsigned char b = 0;
    ON__UINT32 tcode=0;
    ON__INT64 big_value=0;
    if (rc) rc = file.ReadChar(&b);
    if (rc && b) 
    {
      // mesh parameters are in an anonymous chunk
      rc = file.BeginRead3dmBigChunk(&tcode,&big_value);
      if (rc) 
      {
        if ( TCODE_ANONYMOUS_CHUNK == tcode )
        {
          m_mesh_parameters = new ON_MeshParameters();
          rc = m_mesh_parameters->Read( file );
        }
        else
          rc = false;
        if (!file.EndRead3dmChunk())
          rc = false;
      }
    }

    for ( i = 0; rc && i < 4; i++ ) 
    {
      rc = file.ReadChar(&b);
      if (rc && b) 
      {
        // m_kstat[i] curvature stats are in an anonymous chunk
        tcode = 0;
        big_value = 0;
        rc = file.BeginRead3dmBigChunk( &tcode, &big_value );
        if (rc) 
        {
          if ( TCODE_ANONYMOUS_CHUNK == tcode )
          {
            m_kstat[i] = new ON_MeshCurvatureStats();
            rc = m_kstat[i]->Read(file);
          }
          else
            rc = false;
          if ( !file.EndRead3dmChunk() )
            rc = false;
        }
      }
    }

    if (rc) rc = ReadFaceArray( vcount, fcount, file );

    if (rc) {
      if ( major_version==1) {
        rc = Read_1(file);
      }
      else if ( major_version == 3 ) {
        rc = Read_2(vcount,file);
      }
      else
        rc = false;
    }

    if ( minor_version >= 2 ) 
    {
      int b_packed_tex_rotate = m_packed_tex_rotate;
      if (rc) rc = file.ReadInt( &b_packed_tex_rotate );
      m_packed_tex_rotate = b_packed_tex_rotate?true:false;
    }

    if ( 3 == major_version )
    {
      if ( minor_version >= 3 )
      {
        // added for minor version 3.3
        if (rc) rc = file.ReadUuid( m_Ttag.m_mapping_id );

        // compressed m_S[]
        if ( rc && vcount > 0 ) 
        {
          size_t sz = 0;
          bool bFailedCRC=false;
          if (rc) rc = file.ReadCompressedBufferSize( &sz );
          if (rc && sz) 
          {
            if ( sz == vcount*sizeof(ON_2dPoint) )
            {
              m_S.SetCapacity(vcount);
              if (rc) rc = file.ReadCompressedBuffer( sz, m_S.Array(), &bFailedCRC );
              if (rc) m_S.SetCount(vcount);
              if (ON::endian::big_endian == file.Endian())
              {
                file.ToggleByteOrder( m_S.Count()*2, 8, m_S.Array(), (void*)m_S.Array() );
              }
            }
            else
            {
              ON_ERROR("ON_Mesh::Read - surface parameter buffer size is wrong.");
              if (    rc
                   && file.ArchiveOpenNURBSVersion() <= 201011049 
                   && 0 == (sz % sizeof(ON_2dPoint))
                   && sz >= sizeof(ON_2dPoint)
                 )
              {
                // Before 201011049 there was a bug that let m_S[] arrays with
                // the wrong size get saved in files. There was also a bug in 
                // the Rhino .OBJ file reader that created meshes with m_S[] 
                // arrays that had the wrong size.  The next 4 lines of code
                // let us read the junk, discard it and then successfully read
                // the rest of the file.
                int Scount = (int)(sz / sizeof(ON_2dPoint));
                m_S.SetCapacity(Scount);
                rc = file.ReadCompressedBuffer( sz, m_S.Array(), &bFailedCRC );
                m_S.Destroy();
              }
              else
              {
                rc = false; // buffer is wrong size
              }
            }
          }
        }
        if ( minor_version >= 4 && file.ArchiveOpenNURBSVersion() >= 200606010 )
        {
          if (rc) rc = m_Ttag.Read(file);
          if ( minor_version >= 5 )
          {
            if (rc) rc = file.ReadChar( &m_mesh_is_manifold );
            if (rc) rc = file.ReadChar( &m_mesh_is_oriented );
            if (rc) rc = file.ReadChar( &m_mesh_is_solid );

            if ( rc && minor_version >= 6 )
            {
              // added n-gons version 3.6
              bool bHasNgons = false;    
              rc =  file.ReadBool(&bHasNgons);
              if (rc && bHasNgons)
                rc = ReadMeshNgons(file, m_NgonAllocator, m_Ngon);
              if (rc && minor_version >= 7)
              {
                bool bHasDoublePrecisionVertices = false;
                rc = file.ReadBool(&bHasDoublePrecisionVertices);
                bool bHasInvalidDoublePrecisionVertices = false;
                if (bHasDoublePrecisionVertices)
                {
                  // Added explicit double precision vertices chunk version 3.7
                  // (used to be on user data)
                  rc = ReadMeshDoublePrecisionVertices(file, m_dV);
                  if (rc && m_dV.UnsignedCount() == m_V.UnsignedCount())
                  {
                    // Validate m_dV[] - some files contain different values for m_V[] and m_dV[].
                    // When this happens, delete m_dV[].
                    const unsigned int dvcount = m_dV.UnsignedCount();
                    for (unsigned int vdex = 0; vdex < dvcount; vdex++)
                    {
                      const ON_3fPoint P(m_dV[vdex]);
                      const double m = fabs(m_V[vdex].MaximumCoordinate());
                      const double d = fabs((P - m_V[vdex]).MaximumCoordinate());
                      if (d <= m*1.0e-6)
                        continue;
                      bHasInvalidDoublePrecisionVertices = true;
                      m_dV.Destroy();
                      break;
                    }
                  }
                  if (rc && m_dV.UnsignedCount() == m_V.UnsignedCount() && minor_version <= 7)
                  {
                    m_vertex_bbox.Set(m_dV, false);
                  }
                }
                if (rc && minor_version >= 8)
                {
                  rc = file.ReadBoundingBox(m_vertex_bbox);
                }
                if (bHasInvalidDoublePrecisionVertices)
                {
                  m_vertex_bbox.Set(m_V, false);
                }
              }
            }
          }
        }
      }
    }

    if (    0 == m_S.Count()
         && m_V.Count() > 0
         && HasTextureCoordinates()
         && m_srf_domain[0].IsIncreasing() 
         && m_srf_domain[1].IsIncreasing() 
         && m_packed_tex_domain[0].IsInterval()
         && m_packed_tex_domain[1].IsInterval()
         && 0 == m_Ttag.m_mapping_crc
         && ON_UuidIsNil(m_Ttag.m_mapping_id)
          ) 
    {
      // This is a mesh from an old file - but there is enough 
      // information to calculate the m_S[] values from the 
      // m_T[] values.
      m_S.SetCapacity(vcount);
      m_S.SetCount(0);
      ON_2dPoint sp;
      ON_2fPoint tc;
      for ( i = 0; i < vcount; i++)
      {
        tc = m_T[i];
        sp.x = tc.x;
        sp.y = tc.y;
        GetSurfaceParametersHelper(*this,sp.x,sp.y,&sp.x,&sp.y);
        m_S.Append(sp);
      }
      m_Ttag.SetDefaultSurfaceParameterMappingTag();
    }
  }

  return rc;
}